

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

bool __thiscall
QWidgetTextControl::findNextPrevAnchor
          (QWidgetTextControl *this,QTextCursor *startCursor,bool next,QTextCursor *newAnchor)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QWidgetTextControlPrivate *pQVar5;
  ulong uVar6;
  MoveMode *pMVar7;
  QTextCursor *in_RCX;
  byte in_DL;
  long in_FS_OFFSET;
  int startPos_1;
  int startPos;
  int anchorEnd;
  int anchorStart;
  QWidgetTextControlPrivate *d;
  QTextFragment fragment_3;
  QTextFragment fragment_2;
  QTextFragment fragment_1;
  QTextFragment fragment;
  QString anchorHref;
  QTextCharFormat fmt_3;
  QTextCharFormat fmt_2;
  Iterator it_1;
  Iterator blockStart;
  QTextBlock block_1;
  QTextCharFormat fmt_1;
  QTextCharFormat fmt;
  Iterator it;
  QTextBlock block;
  QString *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  bool local_2f1;
  bool local_2db;
  int local_2d8;
  int local_2d0;
  MoveMode local_2c8;
  MoveMode local_2c4;
  bool local_291;
  int local_290 [8];
  undefined1 *local_270;
  undefined1 *local_268;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  QTextDocumentPrivate *local_1a0;
  undefined1 *local_198;
  undefined4 local_190;
  iterator local_188;
  QTextDocumentPrivate *local_170;
  undefined1 *local_168;
  undefined4 local_160;
  QTextBlock local_158;
  undefined1 local_148 [16];
  int local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 local_120 [16];
  int local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  QTextBlock local_f8;
  undefined1 local_e8 [16];
  int local_d8;
  QTextDocumentPrivate *local_d0;
  undefined1 *local_c8;
  undefined4 local_c0;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  undefined1 local_88 [16];
  QTextDocumentPrivate *local_78;
  undefined1 *local_70;
  undefined4 local_68;
  QTextBlock local_60;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 local_30 [16];
  undefined1 *local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QWidgetTextControl *)0x71e9dd);
  local_2c4 = ~MoveAnchor;
  local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
  local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x71ea24);
  local_2c8 = ~MoveAnchor;
  if ((in_DL & 1) == 0) {
    local_2d8 = QTextCursor::selectionStart();
    if (0 < local_2d8) {
      local_2d8 = local_2d8 + -1;
    }
    local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::findBlock((int)local_88);
    local_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::begin();
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::end();
    iVar3 = QTextBlock::position();
    if (local_2d8 == iVar3) {
      QTextBlock::begin();
      local_b8._0_8_ = local_d0;
      local_b8._8_8_ = local_c8;
      local_a8 = (undefined1 *)CONCAT44(local_a8._4_4_,local_c0);
    }
    else {
      do {
        bVar2 = QTextBlock::iterator::operator==((iterator *)local_b8,(iterator *)local_a0);
        if (bVar2) {
          memset(local_e8,0,0x18);
          QTextBlock::iterator::iterator((iterator *)local_e8);
          local_b8._0_8_ = local_e8._0_8_;
          local_b8._8_8_ = local_e8._8_8_;
          local_a8 = (undefined1 *)CONCAT44(local_a8._4_4_,local_d8);
          QTextBlock::QTextBlock(&local_f8);
          QTextBlock::operator=((QTextBlock *)local_88,&local_f8);
        }
        else {
          QTextBlock::iterator::operator--((iterator *)local_b8);
        }
        bVar1 = QTextBlock::iterator::atEnd((iterator *)local_b8);
        bVar2 = false;
        if (!bVar1) {
          QTextBlock::iterator::fragment();
          iVar3 = QTextFragment::position();
          QTextBlock::iterator::fragment();
          iVar4 = QTextFragment::length();
          bVar2 = local_2d8 < iVar3 + iVar4 + -1;
        }
      } while (bVar2);
    }
    while (uVar6 = QTextBlock::isValid(), (uVar6 & 1) != 0) {
      local_2c4 = ~MoveAnchor;
      bVar2 = QTextBlock::iterator::atEnd((iterator *)local_b8);
      if (!bVar2) {
        do {
          local_248 = &DAT_aaaaaaaaaaaaaaaa;
          local_240 = &DAT_aaaaaaaaaaaaaaaa;
          QTextBlock::iterator::fragment();
          local_108 = &DAT_aaaaaaaaaaaaaaaa;
          local_100 = &DAT_aaaaaaaaaaaaaaaa;
          QTextFragment::charFormat();
          bVar2 = QTextCharFormat::isAnchor((QTextCharFormat *)0x71f18b);
          if ((bVar2) && (uVar6 = QTextFormat::hasProperty((int)&local_108), (uVar6 & 1) != 0)) {
            iVar3 = QTextFragment::position();
            iVar4 = QTextFragment::length();
            local_2c4 = iVar3 + iVar4;
            QTextCharFormat::anchorHref((QTextCharFormat *)in_stack_fffffffffffffcf8);
            QString::operator=((QString *)
                               CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                               in_stack_fffffffffffffcf8);
            QString::~QString((QString *)0x71f20d);
            bVar2 = true;
          }
          else {
            bVar2 = QTextBlock::iterator::operator==((iterator *)local_b8,(iterator *)local_a0);
            if (bVar2) {
              memset(local_120,0,0x18);
              QTextBlock::iterator::iterator((iterator *)local_120);
              local_b8._0_8_ = local_120._0_8_;
              local_b8._8_8_ = local_120._8_8_;
              local_a8 = (undefined1 *)CONCAT44(local_a8._4_4_,local_110);
            }
            else {
              QTextBlock::iterator::operator--((iterator *)local_b8);
            }
            bVar2 = false;
          }
          QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x71f2a8);
        } while ((!bVar2) &&
                (bVar2 = QTextBlock::iterator::atEnd((iterator *)local_b8),
                ((bVar2 ^ 0xffU) & 1) != 0));
      }
      if ((local_2c4 != ~MoveAnchor) &&
         (bVar2 = QTextBlock::iterator::atEnd((iterator *)local_b8), !bVar2)) {
        local_2c8 = ~MoveAnchor;
        do {
          local_270 = &DAT_aaaaaaaaaaaaaaaa;
          local_268 = &DAT_aaaaaaaaaaaaaaaa;
          QTextBlock::iterator::fragment();
          local_130 = &DAT_aaaaaaaaaaaaaaaa;
          local_128 = &DAT_aaaaaaaaaaaaaaaa;
          QTextFragment::charFormat();
          bVar2 = QTextCharFormat::isAnchor((QTextCharFormat *)0x71f36a);
          local_2f1 = true;
          if (bVar2) {
            QTextCharFormat::anchorHref((QTextCharFormat *)in_stack_fffffffffffffcf8);
            local_2f1 = ::operator!=((QString *)
                                     CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                                     in_stack_fffffffffffffcf8);
            QString::~QString((QString *)0x71f3cf);
          }
          if (local_2f1 == false) {
            bVar2 = QTextBlock::iterator::operator==((iterator *)local_b8,(iterator *)local_a0);
            if (bVar2) {
              memset(local_148,0,0x18);
              QTextBlock::iterator::iterator((iterator *)local_148);
              local_b8._0_8_ = local_148._0_8_;
              local_b8._8_8_ = local_148._8_8_;
              local_a8 = (undefined1 *)CONCAT44(local_a8._4_4_,local_138);
            }
            else {
              QTextBlock::iterator::operator--((iterator *)local_b8);
            }
            local_2d0 = 0;
          }
          else {
            iVar3 = QTextFragment::position();
            iVar4 = QTextFragment::length();
            local_2c8 = iVar3 + iVar4;
            local_2d0 = 0x12;
          }
          QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x71f49e);
        } while ((local_2d0 == 0) &&
                (bVar2 = QTextBlock::iterator::atEnd((iterator *)local_b8),
                ((bVar2 ^ 0xffU) & 1) != 0));
        if (local_2c8 == ~MoveAnchor) {
          local_290[1] = 0;
          local_290[0] = QTextBlock::position();
          pMVar7 = (MoveMode *)qMax<int>(local_290 + 1,local_290);
          local_2c8 = *pMVar7;
        }
        break;
      }
      QTextBlock::previous();
      QTextBlock::operator=((QTextBlock *)local_88,&local_158);
      QTextBlock::end();
      local_b8._0_8_ = local_170;
      local_b8._8_8_ = local_168;
      local_a8 = (undefined1 *)CONCAT44(local_a8._4_4_,local_160);
      QTextBlock::begin();
      bVar2 = QTextBlock::iterator::operator!=((iterator *)local_b8,&local_188);
      if (bVar2) {
        QTextBlock::iterator::operator--((iterator *)local_b8);
      }
      QTextBlock::begin();
      local_a0._0_8_ = local_1a0;
      local_a0._8_8_ = local_198;
      local_90 = (undefined1 *)CONCAT44(local_90._4_4_,local_190);
    }
  }
  else {
    iVar3 = QTextCursor::selectionEnd();
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::findBlock((int)local_18);
    local_30._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::begin();
    while( true ) {
      bVar1 = QTextBlock::iterator::atEnd((iterator *)local_30);
      bVar2 = false;
      if (!bVar1) {
        QTextBlock::iterator::fragment();
        iVar4 = QTextFragment::position();
        bVar2 = iVar4 < iVar3;
      }
      if (!bVar2) break;
      QTextBlock::iterator::operator++((iterator *)local_30);
    }
    while (uVar6 = QTextBlock::isValid(), (uVar6 & 1) != 0) {
      local_2c4 = ~MoveAnchor;
      while (bVar2 = QTextBlock::iterator::atEnd((iterator *)local_30), ((bVar2 ^ 0xffU) & 1) != 0)
      {
        local_1d8 = &DAT_aaaaaaaaaaaaaaaa;
        local_1d0 = &DAT_aaaaaaaaaaaaaaaa;
        QTextBlock::iterator::fragment();
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        QTextFragment::charFormat();
        bVar2 = QTextCharFormat::isAnchor((QTextCharFormat *)0x71ebca);
        if ((bVar2) && (uVar6 = QTextFormat::hasProperty((int)&local_40), (uVar6 & 1) != 0)) {
          local_2c4 = QTextFragment::position();
          QTextCharFormat::anchorHref((QTextCharFormat *)in_stack_fffffffffffffcf8);
          QString::operator=((QString *)
                             CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                             in_stack_fffffffffffffcf8);
          QString::~QString((QString *)0x71ec30);
          local_2d0 = 6;
        }
        else {
          local_2d0 = 0;
        }
        QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x71ec4f);
        if (local_2d0 != 0) break;
        QTextBlock::iterator::operator++((iterator *)local_30);
      }
      if (local_2c4 != ~MoveAnchor) {
        local_2c8 = ~MoveAnchor;
        goto LAB_0071ec82;
      }
      QTextBlock::next();
      QTextBlock::operator=((QTextBlock *)local_18,&local_60);
      QTextBlock::begin();
      local_30._0_8_ = local_78;
      local_30._8_8_ = local_70;
      local_20 = (undefined1 *)CONCAT44(local_20._4_4_,local_68);
    }
  }
LAB_0071f5f1:
  if ((local_2c4 == ~MoveAnchor) || (local_2c8 == ~MoveAnchor)) {
    local_291 = false;
  }
  else {
    QTextCursor::operator=(in_RCX,&pQVar5->cursor);
    QTextCursor::setPosition((int)in_RCX,local_2c4);
    QTextCursor::setPosition((int)in_RCX,local_2c8);
    local_291 = true;
  }
  QString::~QString((QString *)0x71f661);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_291;
  }
  __stack_chk_fail();
LAB_0071ec82:
  bVar2 = QTextBlock::iterator::atEnd((iterator *)local_30);
  if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_0071edcc;
  local_200 = &DAT_aaaaaaaaaaaaaaaa;
  local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::iterator::fragment();
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QTextFragment::charFormat();
  bVar2 = QTextCharFormat::isAnchor((QTextCharFormat *)0x71ed0d);
  local_2db = true;
  if (bVar2) {
    QTextCharFormat::anchorHref((QTextCharFormat *)in_stack_fffffffffffffcf8);
    local_2db = ::operator!=((QString *)
                             CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                             in_stack_fffffffffffffcf8);
    QString::~QString((QString *)0x71ed72);
  }
  if (local_2db == false) {
    local_2d0 = 0;
  }
  else {
    local_2c8 = QTextFragment::position();
    local_2d0 = 9;
  }
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x71edac);
  if (local_2d0 != 0) goto LAB_0071edcc;
  QTextBlock::iterator::operator++((iterator *)local_30);
  goto LAB_0071ec82;
LAB_0071edcc:
  if (local_2c8 == ~MoveAnchor) {
    iVar3 = QTextBlock::position();
    iVar4 = QTextBlock::length();
    local_2c8 = (iVar3 + iVar4) - KeepAnchor;
  }
  goto LAB_0071f5f1;
}

Assistant:

bool QWidgetTextControl::findNextPrevAnchor(const QTextCursor &startCursor, bool next, QTextCursor &newAnchor)
{
    Q_D(QWidgetTextControl);

    int anchorStart = -1;
    QString anchorHref;
    int anchorEnd = -1;

    if (next) {
        const int startPos = startCursor.selectionEnd();

        QTextBlock block = d->doc->findBlock(startPos);
        QTextBlock::Iterator it = block.begin();

        while (!it.atEnd() && it.fragment().position() < startPos)
            ++it;

        while (block.isValid()) {
            anchorStart = -1;

            // find next anchor
            for (; !it.atEnd(); ++it) {
                const QTextFragment fragment = it.fragment();
                const QTextCharFormat fmt = fragment.charFormat();

                if (fmt.isAnchor() && fmt.hasProperty(QTextFormat::AnchorHref)) {
                    anchorStart = fragment.position();
                    anchorHref = fmt.anchorHref();
                    break;
                }
            }

            if (anchorStart != -1) {
                anchorEnd = -1;

                // find next non-anchor fragment
                for (; !it.atEnd(); ++it) {
                    const QTextFragment fragment = it.fragment();
                    const QTextCharFormat fmt = fragment.charFormat();

                    if (!fmt.isAnchor() || fmt.anchorHref() != anchorHref) {
                        anchorEnd = fragment.position();
                        break;
                    }
                }

                if (anchorEnd == -1)
                    anchorEnd = block.position() + block.length() - 1;

                // make found selection
                break;
            }

            block = block.next();
            it = block.begin();
        }
    } else {
        int startPos = startCursor.selectionStart();
        if (startPos > 0)
            --startPos;

        QTextBlock block = d->doc->findBlock(startPos);
        QTextBlock::Iterator blockStart = block.begin();
        QTextBlock::Iterator it = block.end();

        if (startPos == block.position()) {
            it = block.begin();
        } else {
            do {
                if (it == blockStart) {
                    it = QTextBlock::Iterator();
                    block = QTextBlock();
                } else {
                    --it;
                }
            } while (!it.atEnd() && it.fragment().position() + it.fragment().length() - 1 > startPos);
        }

        while (block.isValid()) {
            anchorStart = -1;

            if (!it.atEnd()) {
                do {
                    const QTextFragment fragment = it.fragment();
                    const QTextCharFormat fmt = fragment.charFormat();

                    if (fmt.isAnchor() && fmt.hasProperty(QTextFormat::AnchorHref)) {
                        anchorStart = fragment.position() + fragment.length();
                        anchorHref = fmt.anchorHref();
                        break;
                    }

                    if (it == blockStart)
                        it = QTextBlock::Iterator();
                    else
                        --it;
                } while (!it.atEnd());
            }

            if (anchorStart != -1 && !it.atEnd()) {
                anchorEnd = -1;

                do {
                    const QTextFragment fragment = it.fragment();
                    const QTextCharFormat fmt = fragment.charFormat();

                    if (!fmt.isAnchor() || fmt.anchorHref() != anchorHref) {
                        anchorEnd = fragment.position() + fragment.length();
                        break;
                    }

                    if (it == blockStart)
                        it = QTextBlock::Iterator();
                    else
                        --it;
                } while (!it.atEnd());

                if (anchorEnd == -1)
                    anchorEnd = qMax(0, block.position());

                break;
            }

            block = block.previous();
            it = block.end();
            if (it != block.begin())
                --it;
            blockStart = block.begin();
        }

    }

    if (anchorStart != -1 && anchorEnd != -1) {
        newAnchor = d->cursor;
        newAnchor.setPosition(anchorStart);
        newAnchor.setPosition(anchorEnd, QTextCursor::KeepAnchor);
        return true;
    }

    return false;
}